

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

ssize_t __thiscall vox::nTRN::write(nTRN *this,int __fd,void *__buf,size_t __n)

{
  reference this_00;
  FILE *__n_00;
  nTRN *__n_01;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  uint local_34;
  undefined8 uStack_30;
  int i;
  size_t childSize;
  size_t contentSize;
  FILE *pFStack_18;
  int32_t id;
  FILE *fp_local;
  nTRN *this_local;
  
  pFStack_18 = (FILE *)CONCAT44(in_register_00000034,__fd);
  fp_local = (FILE *)this;
  contentSize._4_4_ = GetMVID('n','T','R','N');
  fwrite((void *)((long)&contentSize + 4),4,1,pFStack_18);
  childSize = getSize(this);
  fwrite(&childSize,4,1,pFStack_18);
  uStack_30 = 0;
  fwrite(&stack0xffffffffffffffd0,4,1,pFStack_18);
  __n_00 = pFStack_18;
  fwrite(this,4,1,pFStack_18);
  DICT::write(&this->nodeAttribs,(int)pFStack_18,__buf_00,(size_t)__n_00);
  fwrite(&this->childNodeId,4,1,pFStack_18);
  fwrite(&this->reservedId,4,1,pFStack_18);
  fwrite(&this->layerId,4,1,pFStack_18);
  fwrite(&this->numFrames,4,1,pFStack_18);
  local_34 = 0;
  while( true ) {
    if (this->numFrames <= (int)local_34) break;
    __n_01 = this;
    this_00 = std::vector<vox::DICT,_std::allocator<vox::DICT>_>::operator[]
                        (&this->frames,(long)(int)local_34);
    DICT::write(this_00,(int)pFStack_18,__buf_01,(size_t)__n_01);
    local_34 = local_34 + 1;
  }
  return (ulong)local_34;
}

Assistant:

void nTRN::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('n', 'T', 'R', 'N');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&nodeId, sizeof(int32_t), 1, fp);
    nodeAttribs.write(fp);
    fwrite(&childNodeId, sizeof(int32_t), 1, fp);
    fwrite(&reservedId, sizeof(int32_t), 1, fp);
    fwrite(&layerId, sizeof(int32_t), 1, fp);
    fwrite(&numFrames, sizeof(int32_t), 1, fp);
    for (int i = 0; i < numFrames; i++)
        frames[i].write(fp);
}